

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

void ncnn::nms_sorted_bboxes
               (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *bboxes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *picked,float nms_threshold)

{
  bool bVar1;
  vector<float,_std::allocator<float>_> *this;
  const_reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  BBoxRect *in_RDI;
  float in_XMM0_Da;
  float fVar6;
  float union_area;
  float inter_area;
  BBoxRect *b;
  int j;
  int keep;
  BBoxRect *a;
  size_t i_1;
  float height;
  float width;
  BBoxRect *r;
  size_t i;
  vector<float,_std::allocator<float>_> areas;
  size_t n;
  undefined4 in_stack_ffffffffffffff40;
  value_type in_stack_ffffffffffffff44;
  BBoxRect *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int iVar7;
  undefined4 in_stack_ffffffffffffff5c;
  int local_80;
  vector<float,_std::allocator<float>_> *local_70;
  vector<float,_std::allocator<float>_> *local_58;
  vector<float,_std::allocator<float>_> local_38;
  vector<float,_std::allocator<float>_> *local_20;
  float local_14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  BBoxRect *local_8;
  
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16bc84d);
  this = (vector<float,_std::allocator<float>_> *)
         std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size
                   ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_8);
  local_20 = this;
  std::allocator<float>::allocator((allocator<float> *)0x16bc881);
  std::vector<float,_std::allocator<float>_>::vector
            (this,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::allocator<float>::~allocator((allocator<float> *)0x16bc8a7);
  for (local_58 = (vector<float,_std::allocator<float>_> *)0x0; local_58 < local_20;
      local_58 = (vector<float,_std::allocator<float>_> *)
                 ((long)&(local_58->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    pvVar2 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                       ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_8,
                        (size_type)local_58);
    fVar6 = (pvVar2->xmax - pvVar2->xmin) * (pvVar2->ymax - pvVar2->ymin);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(size_type)local_58);
    *pvVar3 = fVar6;
  }
  for (local_70 = (vector<float,_std::allocator<float>_> *)0x0; local_70 < local_20;
      local_70 = (vector<float,_std::allocator<float>_> *)
                 ((long)&(local_70->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_8,
               (size_type)local_70);
    bVar1 = true;
    local_80 = 0;
    while( true ) {
      iVar7 = local_80;
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
      if ((int)sVar4 <= iVar7) break;
      in_stack_ffffffffffffff48 = local_8;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_10,(long)local_80);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_ffffffffffffff48,*pvVar5);
      fVar6 = intersection_area(in_stack_ffffffffffffff48,
                                (BBoxRect *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      in_stack_ffffffffffffff54 = fVar6;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(size_type)local_70)
      ;
      in_stack_ffffffffffffff44 = *pvVar3;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_10,(long)local_80);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,*pvVar5);
      if (local_14 < fVar6 / ((in_stack_ffffffffffffff44 + *pvVar3) - fVar6)) {
        bVar1 = false;
      }
      local_80 = local_80 + 1;
    }
    if (bVar1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (value_type_conflict1 *)in_stack_ffffffffffffff48);
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  return;
}

Assistant:

static void nms_sorted_bboxes(const std::vector<BBoxRect>& bboxes, std::vector<size_t>& picked, float nms_threshold)
{
    picked.clear();

    const size_t n = bboxes.size();

    std::vector<float> areas(n);
    for (size_t i = 0; i < n; i++)
    {
        const BBoxRect& r = bboxes[i];

        float width = r.xmax - r.xmin;
        float height = r.ymax - r.ymin;

        areas[i] = width * height;
    }

    for (size_t i = 0; i < n; i++)
    {
        const BBoxRect& a = bboxes[i];

        int keep = 1;
        for (int j = 0; j < (int)picked.size(); j++)
        {
            const BBoxRect& b = bboxes[picked[j]];

            // intersection over union
            float inter_area = intersection_area(a, b);
            float union_area = areas[i] + areas[picked[j]] - inter_area;
            //             float IoU = inter_area / union_area
            if (inter_area / union_area > nms_threshold)
                keep = 0;
        }

        if (keep)
            picked.push_back(i);
    }
}